

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdGeom.cc
# Opt level: O1

bool __thiscall
tinyusdz::GeomPrimvar::get_value<std::array<float,4ul>>
          (GeomPrimvar *this,array<float,_4UL> *dest,string *err)

{
  Attribute *this_00;
  vtable_type *pvVar1;
  pointer pSVar2;
  undefined1 *puVar3;
  undefined1 *puVar4;
  uint32_t uVar5;
  anon_struct_4_0_00000001_for___align *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  bool bVar7;
  bool bVar8;
  undefined3 local_b0;
  undefined4 uStack_ad;
  anon_struct_4_0_00000001_for___align aStack_a9;
  anon_struct_4_0_00000001_for___align aStack_a5;
  anon_struct_4_0_00000001_for___align aStack_a1;
  undefined5 uStack_9d;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_80;
  undefined1 local_6c [20];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  anon_struct_4_0_00000001_for___align local_45;
  anon_struct_4_0_00000001_for___align aStack_41;
  anon_struct_4_0_00000001_for___align aStack_3d;
  anon_struct_4_0_00000001_for___align aStack_39;
  
  if (dest == (array<float,_4UL> *)0x0) {
joined_r0x004ac82e:
    if (err != (string *)0x0) {
      ::std::__cxx11::string::append((char *)err);
    }
  }
  else {
    if ((this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this->_attr)._var._ts._samples.
        super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pvVar1 = (this->_attr)._var._value.v_.vtable;
      if (pvVar1 == (vtable_type *)0x0) {
        bVar7 = false;
      }
      else {
        uVar5 = (*pvVar1->type_id)();
        bVar7 = uVar5 == 4;
      }
      if ((bVar7) || (((this->_attr)._var._blocked & 1U) != 0)) goto joined_r0x004ac82e;
    }
    if (((this->_attr)._var._blocked == false) &&
       (((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar5 = (*pvVar1->type_id)(), uVar5 == 0)) ||
        ((pvVar1 = (this->_attr)._var._value.v_.vtable, pvVar1 != (vtable_type *)0x0 &&
         (uVar5 = (*pvVar1->type_id)(), uVar5 == 1)))))) {
      if ((this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_attr)._var._ts._samples.
          super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar8 = (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (this->_attr)._var._ts._samples.
                super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar7 = !bVar8;
        if (bVar8) {
          if (err == (string *)0x0) {
            return bVar7;
          }
          ::std::__cxx11::string::append((char *)err);
          return bVar7;
        }
        if ((this->_attr)._var._ts._dirty == true) {
          tinyusdz::value::TimeSamples::update(&(this->_attr)._var._ts);
        }
        pSVar2 = (this->_attr)._var._ts._samples.
                 super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((this->_attr)._var._ts._samples.
            super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
            ._M_impl.super__Vector_impl_data._M_finish == pSVar2) {
          ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
        }
        paVar6 = (anon_struct_4_0_00000001_for___align *)
                 tinyusdz::value::Value::as<std::array<float,4ul>>(&pSVar2->value,false);
        if (paVar6 != (anon_struct_4_0_00000001_for___align *)0x0) {
          local_45 = *paVar6;
          aStack_41 = paVar6[1];
          aStack_3d = paVar6[2];
          aStack_39 = paVar6[3];
          local_90[0] = bVar7;
          goto LAB_004ac94f;
        }
      }
    }
    else {
      this_00 = &this->_attr;
      uVar5 = Attribute::type_id(this_00);
      bVar7 = IsSupportedGeomPrimvarType(uVar5);
      if (bVar7) {
        primvar::PrimVar::get_value<std::array<float,4ul>>
                  ((optional<std::array<float,_4UL>_> *)local_90,&(this->_attr)._var);
        if ((bool)local_90[0] == true) {
          aStack_a9 = (anon_struct_4_0_00000001_for___align)local_90._8_4_;
          aStack_a5 = (anon_struct_4_0_00000001_for___align)local_90._12_4_;
          aStack_a1 = (anon_struct_4_0_00000001_for___align)aStack_80._M_allocated_capacity._0_4_;
          local_45 = (anon_struct_4_0_00000001_for___align)local_90._4_4_;
          aStack_41 = (anon_struct_4_0_00000001_for___align)local_90._8_4_;
          aStack_3d = (anon_struct_4_0_00000001_for___align)local_90._12_4_;
          aStack_39 = (anon_struct_4_0_00000001_for___align)aStack_80._M_allocated_capacity._0_4_;
        }
        if ((bool)local_90[0] == false) {
          if (err == (string *)0x0) {
            return false;
          }
          puVar4 = &aStack_a1.field_0x1;
          local_b0 = SUB83(puVar4,0);
          uStack_ad = (undefined4)((ulong)puVar4 >> 0x18);
          aStack_a9._0_1_ = SUB81((ulong)puVar4 >> 0x38,0);
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,
                     "Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`"
                     ,"");
          local_6c._0_4_ = 0x2b;
          Attribute::type_name_abi_cxx11_((string *)(local_6c + 4),this_00);
          fmt::format<unsigned_int,std::__cxx11::string>
                    ((string *)local_90,(fmt *)&local_b0,(string *)local_6c,(uint *)(local_6c + 4),
                     in_R8);
          ::std::__cxx11::string::_M_append((char *)err,CONCAT44(local_90._4_4_,local_90._0_4_));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_90._4_4_,local_90._0_4_) != &aStack_80) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_90._4_4_,local_90._0_4_),
                            CONCAT44(aStack_80._M_allocated_capacity._4_4_,
                                     aStack_80._M_allocated_capacity._0_4_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_6c._4_8_ != &local_58) {
            operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
          }
          puVar4 = (undefined1 *)CONCAT17(aStack_a9._0_1_,CONCAT43(uStack_ad,local_b0));
          if (puVar4 == &aStack_a1.field_0x1) {
            return false;
          }
          operator_delete(puVar4,CONCAT53(uStack_9d,aStack_a1._1_3_) + 1);
          return false;
        }
LAB_004ac94f:
        dest->_M_elems[0] = (float)local_45;
        *(anon_struct_4_0_00000001_for___align *)(dest->_M_elems + 1) = aStack_41;
        *(anon_struct_4_0_00000001_for___align *)(dest->_M_elems + 2) = aStack_3d;
        *(anon_struct_4_0_00000001_for___align *)(dest->_M_elems + 3) = aStack_39;
        return (bool)local_90[0];
      }
      if (err != (string *)0x0) {
        puVar4 = &aStack_a1.field_0x1;
        local_b0 = SUB83(puVar4,0);
        uStack_ad = (undefined4)((ulong)puVar4 >> 0x18);
        aStack_a9._0_1_ = SUB81((ulong)puVar4 >> 0x38,0);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Unsupported type for GeomPrimvar. type = `{}`","");
        Attribute::type_name_abi_cxx11_((string *)(local_6c + 4),this_00);
        fmt::format<std::__cxx11::string>
                  ((string *)local_90,(fmt *)&local_b0,(string *)(local_6c + 4),in_RCX);
        ::std::__cxx11::string::_M_append((char *)err,CONCAT44(local_90._4_4_,local_90._0_4_));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_90._4_4_,local_90._0_4_) != &aStack_80) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT44(local_90._4_4_,local_90._0_4_),
                          CONCAT44(aStack_80._M_allocated_capacity._4_4_,
                                   aStack_80._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c._4_8_ != &local_58) {
          operator_delete((void *)local_6c._4_8_,local_58._M_allocated_capacity + 1);
        }
        puVar3 = (undefined1 *)CONCAT17(aStack_a9._0_1_,CONCAT43(uStack_ad,local_b0));
        if (puVar3 != puVar4) {
          operator_delete(puVar3,CONCAT53(uStack_9d,aStack_a1._1_3_) + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool GeomPrimvar::get_value(T *dest, std::string *err) const {
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<value::token>::type_id(), "`token` type is not supported as a GeomPrimvar");
  static_assert(tinyusdz::value::TypeTraits<T>::type_id() != value::TypeTraits<std::vector<value::token>>::type_id(), "`token[]` type is not supported as a GeomPrimvar");

  if (!dest) {
    if (err) {
      (*err) += "Output value is nullptr.";
    }
    return false;
  }

  if (_attr.is_blocked()) {
    if (err) {
      (*err) += "Attribute is blocked.";
    }
    return false;
  }

  if (_attr.has_value()) {
    if (!IsSupportedGeomPrimvarType(_attr.type_id())) {
      if (err) {
        (*err) += fmt::format("Unsupported type for GeomPrimvar. type = `{}`",
                              _attr.type_name());
      }
      return false;
    }

    if (auto pv = _attr.get_value<T>()) {

      // copy
      (*dest) = pv.value();
      return true;

    } else {
      if (err) {
        (*err) += fmt::format("Attribute value type mismatch. Requested type `{}` but Attribute has type `{}`", value::TypeTraits<T>::type_id(), _attr.type_name());
      }
      return false;
    }
  }

  if (_attr.has_timesamples()) {
    // Return the first sample.
    const auto &ts = _attr.get_var().ts_raw();
    if (ts.empty()) {
      if (err) {
        (*err) += "No TimeSample value in Attribute..";
      }
      return false;
    }
    
    if (auto pv =ts.get_samples().at(0).value.as<T>()) {
      (*dest) = (*pv);
      return true;
    }
  }

  return false;
}